

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

double var(double *vec,int N)

{
  double dVar1;
  int local_34;
  int i;
  double m;
  double temp;
  double v;
  int N_local;
  double *vec_local;
  
  temp = 0.0;
  dVar1 = mean(vec,N);
  for (local_34 = 0; local_34 < N; local_34 = local_34 + 1) {
    temp = (vec[local_34] - dVar1) * (vec[local_34] - dVar1) + temp;
  }
  return temp / (double)N;
}

Assistant:

double var(double* vec, int N) {
	double v,temp,m;
	int i;
	v = 0.0;	
	m = mean(vec,N);
	
	for (i = 0; i < N; ++i) {
		temp = vec[i] - m;
		v+= temp*temp;
	}
	
	v = v / N;
	
	return v;
	
}